

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

void __thiscall cimg_library::CImgDisplay::_paint(CImgDisplay *this,bool wait_expose)

{
  int iVar1;
  
  if ((this->_is_closed == false) && (this->_image != (XImage *)0x0)) {
    if ((cimg::X11_attr()::val == '\0') &&
       (iVar1 = __cxa_guard_acquire(&cimg::X11_attr()::val), iVar1 != 0)) {
      cimg::X11_info::X11_info(&cimg::X11_attr::val);
      __cxa_atexit(cimg::X11_info::~X11_info,&cimg::X11_attr::val,&__dso_handle);
      __cxa_guard_release(&cimg::X11_attr()::val);
    }
    if (wait_expose) {
      XSendEvent(cimg::X11_attr::val.display,this->_window,0,0);
    }
    else {
      XPutImage(cimg::X11_attr::val.display,this->_window,
                *(undefined8 *)
                 (*(long *)(cimg::X11_attr::val.display + 0xe8) + 0x48 +
                 (long)*(int *)(cimg::X11_attr::val.display + 0xe0) * 0x80),this->_image,0,0,0,0,
                this->_width,this->_height);
    }
  }
  return;
}

Assistant:

void _paint(const bool wait_expose=true) {
      if (_is_closed || !_image) return;
      Display *const dpy = cimg::X11_attr().display;
      if (wait_expose) { // Send an expose event sticked to display window to force repaint.
        XEvent event;
        event.xexpose.type = Expose;
        event.xexpose.serial = 0;
        event.xexpose.send_event = 1;
        event.xexpose.display = dpy;
        event.xexpose.window = _window;
        event.xexpose.x = 0;
        event.xexpose.y = 0;
        event.xexpose.width = width();
        event.xexpose.height = height();
        event.xexpose.count = 0;
        XSendEvent(dpy,_window,0,0,&event);
      } else { // Repaint directly (may be called from the expose event).
        GC gc = DefaultGC(dpy,DefaultScreen(dpy));
#ifdef cimg_use_xshm
        if (_shminfo) XShmPutImage(dpy,_window,gc,_image,0,0,0,0,_width,_height,1);
        else XPutImage(dpy,_window,gc,_image,0,0,0,0,_width,_height);
#else
        XPutImage(dpy,_window,gc,_image,0,0,0,0,_width,_height);
#endif
      }
    }